

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O3

bool getTermSize(uint *width,uint *height)

{
  int iVar1;
  winsize size;
  
  iVar1 = ioctl(0,0x5413);
  if (-1 < iVar1) {
    *width = 0x50;
    *height = 0x18;
  }
  return -1 < iVar1;
}

Assistant:

static bool
getTermSize( unsigned& width, unsigned& height )
{
    // If the system has support for the TIOCGWINSZ or TIOCGSIZE
    // ioctl, use it to obtain the terminal's dimensions.
    int res = -1;
    unsigned w = 0;
    unsigned h = 0;
#if HAVE_TIOCGWINSZ
    winsize size;
    size.ws_col = size.ws_row = 0;
    res = ioctl(0, TIOCGWINSZ, &size);
    w = size.ws_col;
    h = size.ws_row;
#elif HAVE_TIOCGSIZE
    ttysize size;
    size.ts_cols = size.ts_lines = 0;
    res = ioctl(0, TIOCGSIZE, &size);
    w = size.ts_cols;
    h = size.ts_lines;
#endif
    if (res < 0) {
        // The call failed.
        return false;
    }
    if (w == 0 or h == 0) {
        // Kernel doesn't seem to know the terminal's size.     
        // Assume 80x24.
        width = 80;
        height = 24;
        return true;
    }
    width = w;
    height = h;
    return true;
}